

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O1

double TasGrid::RuleLocal::scaleX<(TasGrid::RuleLocal::erule)1>(int point,double x)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  
  if (point != 0) {
    if (point == 2) {
      return x + -1.0;
    }
    if (point == 1) {
      return x + 1.0;
    }
    uVar1 = point - 1;
    if (uVar1 < 2) {
      dVar3 = 1.0;
    }
    else {
      iVar2 = 1;
      do {
        uVar1 = (int)uVar1 >> 1;
        iVar2 = iVar2 * 2;
      } while (1 < uVar1);
      dVar3 = (double)iVar2;
    }
    x = ((x + 3.0) * dVar3 + 1.0) - (double)(point * 2);
  }
  return x;
}

Assistant:

double scaleX(int point, double x) {
        switch(effective_rule) {
            case erule::pwc:
                return 0.0; // should never be called
            case erule::localp:
                switch(point) {
                    case 0: return x;
                    case 1: return (x + 1.0);
                    case 2: return (x - 1.0);
                    default:
                        return ((double) Maths::int2log2(point - 1) * (x + 3.0) + 1.0 - (double) (2*point));
                };
            case erule::semilocalp:
                return ((double) Maths::int2log2(point - 1) * (x + 3.0) + 1.0 - (double) (2*point));
            case erule::localp0:
                return ((double) Maths::int2log2(point + 1) * (x + 3.0) - 3.0 - (double) (2*point));
            default: // case erule::localpb:
                switch(point) {
                    case 0: return (x + 1.0) / 2.0;
                    case 1: return (x - 1.0) / 2.0;
                    case 2: return x;
                    default:
                        return ((double) Maths::int2log2(point - 1) * (x + 3.0) + 1.0 - (double) (2*point));
                };
        };
    }